

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::addsub<(moira::Core)2,(moira::Instr)123,1>(Moira *this,u32 op1,u32 op2)

{
  bool bVar1;
  u32 uVar2;
  u64 data;
  u64 result;
  u32 op2_local;
  u32 op1_local;
  Moira *this_local;
  
  data = ((ulong)op2 - (ulong)op1) - (ulong)((this->reg).sr.x & 1);
  bVar1 = CARRY<1>(data);
  (this->reg).sr.c = bVar1;
  (this->reg).sr.x = bVar1;
  bVar1 = NBIT<1>((ulong)(op1 ^ op2) & (op2 ^ data));
  (this->reg).sr.v = bVar1;
  uVar2 = CLIP<1>(data);
  if (uVar2 != 0) {
    (this->reg).sr.z = false;
  }
  bVar1 = NBIT<1>(data);
  (this->reg).sr.n = bVar1;
  return (u32)data;
}

Assistant:

u32
Moira::addsub(u32 op1, u32 op2)
{
    u64 result;

    switch (I) {

        case Instr::ADD:
        case Instr::ADD_LOOP:
        case Instr::ADDI:
        case Instr::ADDQ:
        {
            result = U64_ADD(op1, op2);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ result) & (op2 ^ result));
            reg.sr.z = ZERO<S>(result);
            break;
        }
        case Instr::ADDX:
        case Instr::ADDX_LOOP:
        {
            result = U64_ADD3(op1, op2, reg.sr.x);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ result) & (op2 ^ result));
            if (CLIP<S>(result)) reg.sr.z = 0;
            break;
        }
        case Instr::SUB:
        case Instr::SUB_LOOP:
        case Instr::SUBI:
        case Instr::SUBQ:
        {
            result = U64_SUB(op2, op1);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ op2) & (op2 ^ result));
            reg.sr.z = ZERO<S>(result);
            break;
        }
        case Instr::SUBX:
        case Instr::SUBX_LOOP:
        {
            result = U64_SUB3(op2, op1, reg.sr.x);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ op2) & (op2 ^ result));
            if (CLIP<S>(result)) reg.sr.z = 0;
            break;
        }

        default:
            fatalError;
    }

    reg.sr.n = NBIT<S>(result);

    return (u32)result;
}